

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall
CodeGenGenericContext::InvalidateAddressValue(CodeGenGenericContext *this,x86Argument arg)

{
  x86Argument *pxVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  uint argSize_1;
  uint dataSize_1;
  x86Argument *data_1;
  uint i_1;
  uint argSize;
  uint dataSize;
  x86Argument *data;
  uint i;
  CodeGenGenericContext *this_local;
  
  if (arg.type != argPtr) {
    __assert_fail("arg.type == x86Argument::argPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x112,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
  }
  data._4_4_ = 0;
  while( true ) {
    if (0x10 < data._4_4_) break;
    pxVar1 = this->genReg + data._4_4_;
    if ((((pxVar1->type == argPtr) && ((pxVar1->ptrIndex != rNONE || (pxVar1->ptrBase != rR14)))) &&
        ((pxVar1->ptrIndex != rNONE ||
         ((pxVar1->ptrBase != rEBX || ((arg.ptrIndex == rNONE && (arg.ptrBase == rEBX)))))))) &&
       (((pxVar1->ptrIndex == rNONE && (pxVar1->ptrBase == rEBX)) ||
        ((arg.ptrIndex != rNONE || (arg.ptrBase != rEBX)))))) {
      if ((pxVar1->ptrIndex == rNONE) &&
         ((arg.ptrIndex == rNONE && (pxVar1->ptrBase == arg.ptrBase)))) {
        if ((pxVar1->field_1).reg == rNONE) {
          __assert_fail("data.ptrSize != sNONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x128,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
        }
        if (arg.field_1.reg == rNONE) {
          __assert_fail("arg.ptrSize != sNONE",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x129,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
        }
        if ((pxVar1->field_1).reg == rEAX) {
          local_54 = 1;
        }
        else {
          if ((pxVar1->field_1).reg == rEBX) {
            local_58 = 2;
          }
          else {
            local_58 = 8;
            if ((pxVar1->field_1).reg == rECX) {
              local_58 = 4;
            }
          }
          local_54 = local_58;
        }
        if (arg.field_1.reg == rEAX) {
          local_5c = 1;
        }
        else {
          if (arg.field_1.reg == rEBX) {
            local_60 = 2;
          }
          else {
            local_60 = 8;
            if (arg.field_1.reg == rECX) {
              local_60 = 4;
            }
          }
          local_5c = local_60;
        }
        if (((uint)(arg.ptrNum + local_5c) <= (uint)pxVar1->ptrNum) ||
           ((uint)(pxVar1->ptrNum + local_54) <= (uint)arg.ptrNum)) goto LAB_003a4fc3;
      }
      pxVar1->type = argNone;
    }
LAB_003a4fc3:
    data._4_4_ = data._4_4_ + 1;
  }
  data_1._4_4_ = 0;
  do {
    if (0xf < data_1._4_4_) {
      return;
    }
    pxVar1 = this->xmmReg + data_1._4_4_;
    if ((((pxVar1->type == argPtr) && ((pxVar1->ptrIndex != rNONE || (pxVar1->ptrBase != rR14)))) &&
        ((pxVar1->ptrIndex != rNONE ||
         ((pxVar1->ptrBase != rEBX || ((arg.ptrIndex == rNONE && (arg.ptrBase == rEBX)))))))) &&
       (((pxVar1->ptrIndex == rNONE && (pxVar1->ptrBase == rEBX)) ||
        ((arg.ptrIndex != rNONE || (arg.ptrBase != rEBX)))))) {
      if ((pxVar1->ptrIndex == rNONE) &&
         ((arg.ptrIndex == rNONE && (pxVar1->ptrBase == arg.ptrBase)))) {
        bVar4 = true;
        if ((pxVar1->field_1).reg != rECX) {
          bVar4 = (pxVar1->field_1).reg == rEDX;
        }
        if (!bVar4) {
          __assert_fail("data.ptrSize == sDWORD || data.ptrSize == sQWORD",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x14a,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
        }
        bVar4 = true;
        if ((pxVar1->field_1).reg != rECX) {
          bVar4 = (pxVar1->field_1).reg == rEDX;
        }
        if (!bVar4) {
          __assert_fail("data.ptrSize == sDWORD || data.ptrSize == sQWORD",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x14b,"void CodeGenGenericContext::InvalidateAddressValue(x86Argument)");
        }
        iVar2 = 8;
        if ((pxVar1->field_1).reg == rECX) {
          iVar2 = 4;
        }
        iVar3 = 8;
        if (arg.field_1.reg == rECX) {
          iVar3 = 4;
        }
        if (((uint)(arg.ptrNum + iVar3) <= (uint)pxVar1->ptrNum) ||
           ((uint)(pxVar1->ptrNum + iVar2) <= (uint)arg.ptrNum)) goto LAB_003a51a0;
      }
      pxVar1->type = argNone;
    }
LAB_003a51a0:
    data_1._4_4_ = data_1._4_4_ + 1;
  } while( true );
}

Assistant:

void CodeGenGenericContext::InvalidateAddressValue(x86Argument arg)
{
	assert(arg.type == x86Argument::argPtr);

	for(unsigned i = 0; i < rRegCount; i++)
	{
		x86Argument &data = genReg[i];

		if(data.type == x86Argument::argPtr)
		{
			// Can't rewrite constants
			if(data.ptrIndex == rNONE && data.ptrBase == rR14)
				continue;

			// If register contains data from register memory block, no memory update using a different register can overwrite it
			if(data.ptrIndex == rNONE && data.ptrBase == rEBX && (arg.ptrIndex != rNONE || arg.ptrBase != rEBX))
				continue;

			// If register doesn't contain data from a register memory block, register memory update can't overwrite it
			if((data.ptrIndex != rNONE || data.ptrBase != rEBX) && arg.ptrIndex == rNONE && arg.ptrBase == rEBX)
				continue;

			if(data.ptrIndex == rNONE && arg.ptrIndex == rNONE && data.ptrBase == arg.ptrBase)
			{
				assert(data.ptrSize != sNONE);
				assert(arg.ptrSize != sNONE);

				unsigned dataSize = data.ptrSize == sBYTE ? 1 : (data.ptrSize == sWORD ? 2 : (data.ptrSize == sDWORD ? 4 : 8));
				unsigned argSize = arg.ptrSize == sBYTE ? 1 : (arg.ptrSize == sWORD ? 2 : (arg.ptrSize == sDWORD ? 4 : 8));

				if(unsigned(arg.ptrNum) + argSize <= unsigned(data.ptrNum) || unsigned(arg.ptrNum) >= unsigned(data.ptrNum) + dataSize)
					continue;
			}

			data.type = x86Argument::argNone;
		}
	}

	for(unsigned i = 0; i < rXmmRegCount; i++)
	{
		x86Argument &data = xmmReg[i];

		if(data.type == x86Argument::argPtr)
		{
			// Can't rewrite constants
			if(data.ptrIndex == rNONE && data.ptrBase == rR14)
				continue;

			// If register contains data from register memory block, no memory update using a different register can overwrite it
			if(data.ptrIndex == rNONE && data.ptrBase == rEBX && (arg.ptrIndex != rNONE || arg.ptrBase != rEBX))
				continue;

			// If register doesn't contain data from a register memory block, register memory update can't overwrite it
			if((data.ptrIndex != rNONE || data.ptrBase != rEBX) && arg.ptrIndex == rNONE && arg.ptrBase == rEBX)
				continue;

			if(data.ptrIndex == rNONE && arg.ptrIndex == rNONE && data.ptrBase == arg.ptrBase)
			{
				assert(data.ptrSize == sDWORD || data.ptrSize == sQWORD);
				assert(data.ptrSize == sDWORD || data.ptrSize == sQWORD);

				unsigned dataSize = data.ptrSize == sDWORD ? 4 : 8;
				unsigned argSize = arg.ptrSize == sDWORD ? 4 : 8;

				if(unsigned(arg.ptrNum) + argSize <= unsigned(data.ptrNum) || unsigned(arg.ptrNum) >= unsigned(data.ptrNum) + dataSize)
					continue;
			}

			data.type = x86Argument::argNone;
		}
	}
}